

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O2

bool __thiscall
Rml::DataViews::Update(DataViews *this,DataModel *model,DirtyVariables *dirty_variables)

{
  NameViewMap *this_00;
  pointer puVar1;
  pointer pbVar2;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *puVar3;
  DataView *pDVar4;
  ObserverPtrBlock *pOVar5;
  long lVar6;
  code *pcVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  bool bVar10;
  int iVar11;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  __first;
  ulong uVar12;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  _Var13;
  String *variable_name_1;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *__args;
  pointer __k;
  DataView **ppDVar14;
  pointer puVar15;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  __i;
  long lVar16;
  DataView **ppDVar17;
  uint uVar18;
  String *variable_name;
  _Head_base<0UL,_Rml::DataView_*,_false> _Var19;
  pointer pbVar20;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>_>
  pVar21;
  Vector<DataView_*> dirty_views;
  long local_b8;
  pointer local_b0;
  DataView **local_a8;
  const_iterator cStack_a0;
  undefined8 local_98;
  DirtyVariables *local_90;
  undefined8 local_88;
  DataViewList *local_80;
  DataViewList *local_78;
  pointer local_70;
  ulong local_68;
  DataModel *local_60;
  __node_type *local_58;
  _Head_base<0UL,_Rml::DataView_*,_false> local_50;
  _Head_base<0UL,_Rml::DataView_*,_false> local_48;
  DataView *local_40;
  
  local_78 = &this->views_to_add;
  this_00 = &this->name_view_map;
  local_80 = &this->views_to_remove;
  local_58 = (__node_type *)&(this->name_view_map)._M_h._M_before_begin;
  local_68 = 0;
  local_b8 = 0;
  local_88 = 0;
  local_90 = dirty_variables;
  local_60 = model;
  do {
    puVar15 = (this->views_to_add).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->views_to_add).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = (uint)local_68;
    if (uVar18 != 0) {
      if (puVar15 == puVar1) {
        if ((9 < uVar18) ||
           (local_b8 ==
            (long)(local_90->m_container).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_90->m_container).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5)) goto LAB_0026cc3d;
      }
      else if (9 < uVar18) {
LAB_0026cc3d:
        return (bool)((byte)local_88 & 1);
      }
    }
    __k = (local_90->m_container).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (local_90->m_container).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98 = 0;
    local_a8 = (DataView **)0x0;
    cStack_a0._M_current = (DataView **)0x0;
    pbVar20 = __k;
    local_b0 = pbVar2;
    if (puVar15 != puVar1) {
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::reserve(&this->views,
                ((long)puVar1 - (long)puVar15 >> 3) +
                ((long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      puVar3 = (this->views_to_add).
               super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_70 = __k;
      for (__args = (this->views_to_add).
                    super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != puVar3; __args = __args + 1
          ) {
        local_48._M_head_impl =
             (__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>._M_t
             .super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
             super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
        ::std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>::emplace_back<Rml::DataView*>
                  ((vector<Rml::DataView*,std::allocator<Rml::DataView*>> *)&local_a8,
                   &local_48._M_head_impl);
        (*(((__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>._M_t.
            super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
            super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl)->super_Releasable).
          _vptr_Releasable[5])(&local_48);
        pDVar4 = local_40;
        for (_Var19._M_head_impl = local_48._M_head_impl; _Var19._M_head_impl != pDVar4;
            _Var19._M_head_impl = (DataView *)&_Var19._M_head_impl[1].attached_element) {
          local_50._M_head_impl =
               (__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
               _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
               super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string_const&,Rml::DataView*>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)this_00,_Var19._M_head_impl,&local_50);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        ::std::
        vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
        ::emplace_back<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>
                  ((vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
                    *)this,__args);
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::clear(local_78);
      __k = (local_90->m_container).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (local_90->m_container).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pbVar20 = local_70;
    }
    local_b8 = (long)pbVar2 - (long)pbVar20 >> 5;
    for (; __k != local_b0; __k = __k + 1) {
      pVar21 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::equal_range(&this_00->_M_h,__k);
      for (_Var13._M_cur =
                (__node_type *)
                pVar21.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                ._M_cur;
          (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
           )_Var13._M_cur !=
          pVar21.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ._M_cur.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ; _Var13._M_cur = (__node_type *)((_Var13._M_cur)->super__Hash_node_base)._M_nxt) {
        ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::push_back
                  ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)&local_a8,
                   (value_type *)
                   ((long)&((_Var13._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>
                           ._M_storage._M_storage + 0x20));
      }
    }
    ::std::
    __sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a8,cStack_a0._M_current);
    __first = ::std::
              __unique<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_a8,cStack_a0._M_current);
    ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::erase
              ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)&local_a8,
               (const_iterator)__first._M_current,cStack_a0);
    cVar9._M_current = cStack_a0._M_current;
    ppDVar14 = local_a8;
    cVar8._M_current = cStack_a0._M_current;
    if (local_a8 != cStack_a0._M_current) {
      lVar16 = (long)cStack_a0._M_current - (long)local_a8;
      uVar12 = lVar16 >> 3;
      lVar6 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                (local_a8,cStack_a0._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar16 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar14,cVar9._M_current);
        ppDVar14 = local_a8;
        cVar8._M_current = cStack_a0._M_current;
      }
      else {
        ppDVar17 = ppDVar14 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar14,ppDVar17);
        for (; ppDVar14 = local_a8, cVar8._M_current = cStack_a0._M_current,
            ppDVar17 != cVar9._M_current; ppDVar17 = ppDVar17 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Val_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                    (ppDVar17);
        }
      }
    }
    for (; ppDVar14 != cVar8._M_current; ppDVar14 = ppDVar14 + 1) {
      pDVar4 = *ppDVar14;
      if (pDVar4 == (DataView *)0x0) {
        bVar10 = Assert("RMLUI_ASSERT(view)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                        ,0x88);
        if (!bVar10) {
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
      }
      else {
        pOVar5 = (pDVar4->attached_element).block;
        if ((pOVar5 != (ObserverPtrBlock *)0x0) && (pOVar5->pointed_to_object != (void *)0x0)) {
          iVar11 = (*(pDVar4->super_Releasable)._vptr_Releasable[4])(pDVar4,local_60);
          local_88 = CONCAT71((int7)((ulong)local_88 >> 8),(byte)local_88 | (byte)iVar11);
        }
      }
    }
    puVar15 = (this->views_to_remove).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->views_to_remove).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar1) {
LAB_0026cbf1:
      _Var13._M_cur = local_58;
      if (puVar15 != puVar1) {
        do {
          _Var13._M_cur = (__node_type *)((_Var13._M_cur)->super__Hash_node_base)._M_nxt;
          while( true ) {
            if (_Var13._M_cur == (__node_type *)0x0) {
              puVar15 = puVar15 + 1;
              goto LAB_0026cbf1;
            }
            if (*(DataView **)((long)_Var13._M_cur + 0x28) !=
                (puVar15->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
                _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
                super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl) break;
            _Var13._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::erase(&this_00->_M_h,_Var13._M_cur);
          }
        } while( true );
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::clear(local_80);
    }
    ::std::_Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::~_Vector_base
              ((_Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)&local_a8);
    local_68 = (ulong)((int)local_68 + 1);
  } while( true );
}

Assistant:

bool DataViews::Update(DataModel& model, const DirtyVariables& dirty_variables)
{
	bool result = false;
	size_t num_dirty_variables_prev = 0;

	// View updates may result in newly added views, or even new dirty variables. Thus, we do the
	// update recursively but with an upper limit. Without the loop, newly added views won't be
	// updated until the next Update() call.
	for (int i = 0; (i == 0 || !views_to_add.empty() || num_dirty_variables_prev != dirty_variables.size()) && i < 10; i++)
	{
		num_dirty_variables_prev = dirty_variables.size();

		Vector<DataView*> dirty_views;

		if (!views_to_add.empty())
		{
			views.reserve(views.size() + views_to_add.size());
			for (auto&& view : views_to_add)
			{
				dirty_views.push_back(view.get());
				for (const String& variable_name : view->GetVariableNameList())
					name_view_map.emplace(variable_name, view.get());

				views.push_back(std::move(view));
			}
			views_to_add.clear();
		}

		for (const String& variable_name : dirty_variables)
		{
			auto pair = name_view_map.equal_range(variable_name);
			for (auto it = pair.first; it != pair.second; ++it)
				dirty_views.push_back(it->second);
		}

		// Remove duplicate entries
		std::sort(dirty_views.begin(), dirty_views.end());
		auto it_remove = std::unique(dirty_views.begin(), dirty_views.end());
		dirty_views.erase(it_remove, dirty_views.end());

		// Sort by the element's depth in the document tree so that any structural changes due to a changed variable are reflected in the element's
		// children. Eg. the 'data-for' view will remove children if any of its data variable array size is reduced.
		std::sort(dirty_views.begin(), dirty_views.end(), [](auto&& left, auto&& right) { return left->GetSortOrder() < right->GetSortOrder(); });

		for (DataView* view : dirty_views)
		{
			RMLUI_ASSERT(view);
			if (!view)
				continue;

			if (view->IsValid())
				result |= view->Update(model);
		}

		// Destroy views marked for destruction
		// @performance: Horrible...
		if (!views_to_remove.empty())
		{
			for (const auto& view : views_to_remove)
			{
				for (auto it = name_view_map.begin(); it != name_view_map.end();)
				{
					if (it->second == view.get())
						it = name_view_map.erase(it);
					else
						++it;
				}
			}

			views_to_remove.clear();
		}
	}

	return result;
}